

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O1

void __thiscall
fasttext::Model::findKBest
          (Model *this,int32_t k,real threshold,
          vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *heap,
          Vector *hidden,Vector *output)

{
  pointer *pppVar1;
  float fVar2;
  int iVar3;
  iterator __position;
  pointer ppVar4;
  pointer ppVar5;
  bool bVar6;
  undefined4 extraout_var;
  long lVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  double dVar12;
  pair<float,_int> local_38;
  
  if (((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->loss ==
      ova) {
    computeOutputSigmoid(this,hidden,output);
  }
  else {
    computeOutputSoftmax(this,hidden,output);
  }
  if (0 < this->osz_) {
    lVar7 = 0;
    do {
      fVar2 = (output->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start[lVar7];
      if ((threshold <= fVar2) &&
         (((long)(heap->
                 super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>)
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(heap->
                 super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>)
                 ._M_impl.super__Vector_impl_data._M_start >> 3 != (long)k ||
          (dVar12 = ::log((double)fVar2 + 1e-05),
          ((heap->super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>
           )._M_impl.super__Vector_impl_data._M_start)->first <= (float)dVar12)))) {
        dVar12 = ::log((double)(output->data_).super__Vector_base<float,_std::allocator<float>_>.
                               _M_impl.super__Vector_impl_data._M_start[lVar7] + 1e-05);
        local_38 = (pair<float,_int>)(CONCAT44(extraout_var,(float)dVar12) | lVar7 << 0x20);
        __position._M_current =
             (heap->
             super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>).
             _M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (heap->
            super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>).
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<std::pair<float,int>,std::allocator<std::pair<float,int>>>::
          _M_realloc_insert<std::pair<float,int>>
                    ((vector<std::pair<float,int>,std::allocator<std::pair<float,int>>> *)heap,
                     __position,&local_38);
        }
        else {
          *__position._M_current = local_38;
          pppVar1 = &(heap->
                     super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
          *pppVar1 = *pppVar1 + 1;
        }
        ppVar4 = (heap->
                 super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>)
                 ._M_impl.super__Vector_impl_data._M_start;
        ppVar5 = (heap->
                 super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>)
                 ._M_impl.super__Vector_impl_data._M_finish;
        fVar2 = ppVar5[-1].first;
        iVar3 = ppVar5[-1].second;
        uVar8 = (long)ppVar5 - (long)ppVar4 >> 3;
        lVar9 = uVar8 - 1;
        if (1 < (long)uVar8) {
          do {
            lVar10 = (lVar9 + -1) - (lVar9 + -1 >> 0x3f) >> 1;
            if (ppVar4[lVar10].first <= fVar2) break;
            ppVar4[lVar9].first = ppVar4[lVar10].first;
            ppVar4[lVar9].second = ppVar4[lVar10].second;
            bVar6 = 2 < lVar9;
            lVar9 = lVar10;
          } while (bVar6);
        }
        ppVar4[lVar9].first = fVar2;
        ppVar4[lVar9].second = iVar3;
        if ((ulong)(long)k < uVar8) {
          if (8 < (long)ppVar5 - (long)ppVar4) {
            fVar2 = ppVar5[-1].first;
            iVar3 = ppVar5[-1].second;
            ppVar5[-1].first = ppVar4->first;
            ppVar5[-1].second = ppVar4->second;
            uVar8 = (long)(ppVar5 + -1) - (long)ppVar4;
            lVar9 = (long)uVar8 >> 3;
            if (lVar9 < 3) {
              lVar10 = 0;
            }
            else {
              lVar11 = 0;
              do {
                if (ppVar4[lVar11 * 2 + 1].first < ppVar4[lVar11 * 2 + 2].first) {
                  lVar10 = lVar11 * 2 + 1;
                }
                else {
                  lVar10 = lVar11 * 2 + 2;
                }
                ppVar4[lVar11].first = ppVar4[lVar10].first;
                ppVar4[lVar11].second = ppVar4[lVar10].second;
                lVar11 = lVar10;
              } while (lVar10 < (lVar9 + -1) - (lVar9 + -1 >> 0x3f) >> 1);
            }
            if (((uVar8 & 8) == 0) && (lVar10 == lVar9 + -2 >> 1)) {
              ppVar4[lVar10].first = ppVar4[lVar10 * 2 + 1].first;
              ppVar4[lVar10].second = ppVar4[lVar10 * 2 + 1].second;
              lVar10 = lVar10 * 2 + 1;
            }
            if (0 < lVar10) {
              do {
                lVar9 = (lVar10 + -1) - (lVar10 + -1 >> 0x3f) >> 1;
                if (ppVar4[lVar9].first <= fVar2) break;
                ppVar4[lVar10].first = ppVar4[lVar9].first;
                ppVar4[lVar10].second = ppVar4[lVar9].second;
                bVar6 = 2 < lVar10;
                lVar10 = lVar9;
              } while (bVar6);
            }
            ppVar4[lVar10].first = fVar2;
            ppVar4[lVar10].second = iVar3;
          }
          (heap->super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>)
          ._M_impl.super__Vector_impl_data._M_finish = ppVar5 + -1;
        }
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < this->osz_);
  }
  return;
}

Assistant:

void Model::findKBest(
		int32_t k,
		real threshold,
		std::vector<std::pair<real, int32_t>>& heap,
		Vector& hidden,
		Vector& output) const {
	if (args_->loss == loss_name::ova) {
		computeOutputSigmoid(hidden, output);
	} else {
		computeOutputSoftmax(hidden, output);
	}
	for (int32_t i = 0; i < osz_; i++) {
		if (output[i] < threshold) {
			continue;
		}
		if (heap.size() == k && std_log(output[i]) < heap.front().first) {
			continue;
		}
		heap.push_back(std::make_pair(std_log(output[i]), i));
		std::push_heap(heap.begin(), heap.end(), comparePairs);
		if (heap.size() > k) {
			std::pop_heap(heap.begin(), heap.end(), comparePairs);
			heap.pop_back();
		}
	}
}